

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processBinaryWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  byte local_41;
  int local_40;
  int iStack_3c;
  uchar output;
  int i;
  int rightDigits;
  int leftDigits;
  int commaIndex;
  int length;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  iVar1 = std::__cxx11::string::size();
  rightDigits = -1;
  i = -1;
  iStack_3c = -1;
  local_40 = 0;
  do {
    if (iVar1 <= local_40) {
      if (rightDigits == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
        poVar3 = std::operator<<(poVar3," at token: ");
        poVar3 = std::operator<<(poVar3,(string *)word);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cerr,"cannot start binary number with a comma");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
      else if (rightDigits == iVar1 + -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
        poVar3 = std::operator<<(poVar3," at token: ");
        poVar3 = std::operator<<(poVar3,(string *)word);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cerr,"cannot end binary number with a comma");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 0;
      }
      else {
        if (rightDigits == -1) {
          if (8 < iVar1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
            poVar3 = std::operator<<(poVar3," at token: ");
            poVar3 = std::operator<<(poVar3,(string *)word);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cerr,"too many digits in binary number");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            return 0;
          }
        }
        else {
          i = rightDigits;
          iStack_3c = (iVar1 - rightDigits) + -1;
        }
        if (i < 5) {
          if (iStack_3c < 5) {
            local_41 = 0;
            if (rightDigits == -1) {
              for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
                local_41 = local_41 << 1 | *pcVar2 - 0x30U;
              }
            }
            else {
              for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
                local_41 = local_41 << 1 | *pcVar2 - 0x30U;
              }
              local_41 = local_41 << (4U - (char)iStack_3c & 0x1f);
              local_40 = rightDigits;
              while (local_40 = local_40 + 1, local_40 < iStack_3c + rightDigits + 1) {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
                local_41 = local_41 << 1 | *pcVar2 - 0x30U;
              }
            }
            std::operator<<(out,local_41);
            this_local._4_4_ = 1;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
            poVar3 = std::operator<<(poVar3," at token: ");
            poVar3 = std::operator<<(poVar3,(string *)word);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cerr,"too many digits to right of comma");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this_local._4_4_ = 0;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
          poVar3 = std::operator<<(poVar3," at token: ");
          poVar3 = std::operator<<(poVar3,(string *)word);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          poVar3 = std::operator<<((ostream *)&std::cerr,"too many digits to left of comma");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = 0;
        }
      }
      return this_local._4_4_;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
    if (*pcVar2 == ',') {
      if (rightDigits != -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
        poVar3 = std::operator<<(poVar3," at token: ");
        poVar3 = std::operator<<(poVar3,(string *)word);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cerr,"extra comma in binary number");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return 0;
      }
      rightDigits = local_40;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
      if ((*pcVar2 != '1') &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar2 != '0')) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
        poVar3 = std::operator<<(poVar3," at token: ");
        poVar3 = std::operator<<(poVar3,(string *)word);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Invalid character in binary number (character is ");
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word);
        poVar3 = std::operator<<(poVar3,*pcVar2);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        return 0;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int Binasc::processBinaryWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();        // length of ascii binary number
	int commaIndex = -1;             // index location of comma in number
	int leftDigits = -1;             // number of digits to left of comma
	int rightDigits = -1;            // number of digits to right of comma
	int i = 0;

	// make sure that all characters are valid
	for (i=0; i<length; i++) {
		if (word [i] == ',') {
			if (commaIndex != -1) {
				std::cerr << "Error on line " << lineNum << " at token: " << word
					  << std::endl;
				std::cerr << "extra comma in binary number" << std::endl;
				return 0;
			} else {
				commaIndex = i;
			}
		} else if (!(word[i] == '1' || word[i] == '0')) {
			std::cerr << "Error on line " << lineNum << " at token: " << word
				  << std::endl;
			std::cerr << "Invalid character in binary number"
					  " (character is " << word[i] <<")" << std::endl;
			return 0;
		}
	}

	// comma cannot start or end number
	if (commaIndex == 0) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot start binary number with a comma" << std::endl;
		return 0;
	} else if (commaIndex == length - 1 ) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "cannot end binary number with a comma" << std::endl;
		return 0;
	}

	// figure out how many digits there are in binary number
	// number must be able to fit into one byte.
	if (commaIndex != -1) {
		leftDigits = commaIndex;
		rightDigits = length - commaIndex - 1;
	} else if (length > 8) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits in binary number" << std::endl;
		return 0;
	}
	// if there is a comma, then there cannot be more than 4 digits on a side
	if (leftDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to left of comma" << std::endl;
		return 0;
	}
	if (rightDigits > 4) {
		std::cerr << "Error on line " << lineNum << " at token: " << word
			  << std::endl;
		std::cerr << "too many digits to right of comma" << std::endl;
		return 0;
	}

	// OK, we have a valid binary number, so calculate the byte

	uchar output = 0;

	// if no comma in binary number
	if (commaIndex == -1) {
		for (i=0; i<length; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}
	// if comma in binary number
	else {
		for (i=0; i<leftDigits; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
		output = output << (4-rightDigits);
		for (i=0+commaIndex+1; i<rightDigits+commaIndex+1; i++) {
			output = output << 1;
			output |= word[i] - '0';
		}
	}

	// send the byte to the output
	out << output;
	return 1;
}